

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ptls_async_job_t *
async_sign_ctx_new(ptls_openssl_signature_scheme_t *scheme,EVP_MD_CTX *ctx,size_t siglen)

{
  _func_EVP_MD_ptr *p_Var1;
  async_sign_ctx *self;
  size_t siglen_local;
  EVP_MD_CTX *ctx_local;
  ptls_openssl_signature_scheme_t *scheme_local;
  
  scheme_local = (ptls_openssl_signature_scheme_t *)malloc(siglen + 0x40);
  if (scheme_local == (ptls_openssl_signature_scheme_t *)0x0) {
    scheme_local = (ptls_openssl_signature_scheme_t *)0x0;
  }
  else {
    *(code **)scheme_local = async_sign_ctx_free;
    scheme_local->scheme_md = async_sign_ctx_get_fd;
    *(undefined8 *)(scheme_local + 1) = 0;
    scheme_local[1].scheme_md = (_func_EVP_MD_ptr *)scheme;
    *(EVP_MD_CTX **)(scheme_local + 2) = ctx;
    p_Var1 = (_func_EVP_MD_ptr *)ASYNC_WAIT_CTX_new();
    scheme_local[2].scheme_md = p_Var1;
    *(undefined8 *)(scheme_local + 3) = 0;
    scheme_local[3].scheme_md = (_func_EVP_MD_ptr *)siglen;
    memset(scheme_local + 4,0,siglen);
  }
  return (ptls_async_job_t *)scheme_local;
}

Assistant:

static ptls_async_job_t *async_sign_ctx_new(const ptls_openssl_signature_scheme_t *scheme, EVP_MD_CTX *ctx, size_t siglen)
{
    struct async_sign_ctx *self;

    if ((self = malloc(offsetof(struct async_sign_ctx, sig) + siglen)) == NULL)
        return NULL;

    self->super = (ptls_async_job_t){async_sign_ctx_free, async_sign_ctx_get_fd};
    self->scheme = scheme;
    self->ctx = ctx;
    self->waitctx = ASYNC_WAIT_CTX_new();
    self->job = NULL;
    self->siglen = siglen;
    memset(self->sig, 0, siglen);

    return &self->super;
}